

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileImporter::createMaterials(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  int iVar1;
  ulong uVar2;
  aiMaterial **ppaVar3;
  const_iterator cVar4;
  ObjFileImporter *pOVar5;
  Logger *pLVar6;
  ulong uVar7;
  ObjFileImporter *pOVar8;
  aiString *pInput;
  aiString *paVar9;
  uint i;
  uint index;
  long lVar10;
  bool bVar11;
  int uvwIndex;
  ObjFileImporter *local_80;
  int local_74;
  aiString *local_70;
  aiScene *local_68;
  ulong local_60;
  Model *local_58;
  _Base_ptr local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
  *local_48;
  ulong local_40;
  ulong local_38;
  
  if (pScene != (aiScene *)0x0) {
    uVar2 = (long)(pModel->m_MaterialLib).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pModel->m_MaterialLib).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pScene->mNumMaterials = 0;
    if ((pModel->m_MaterialLib).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pModel->m_MaterialLib).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"OBJ: no materials specified");
      return;
    }
    uVar7 = uVar2 >> 5;
    ppaVar3 = (aiMaterial **)operator_new__(uVar2 >> 2 & 0x7fffffff8);
    pScene->mMaterials = ppaVar3;
    local_48 = &pModel->m_MaterialMap;
    local_50 = &(pModel->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = uVar7 & 0xffffffff;
    local_68 = pScene;
    local_60 = uVar7;
    local_58 = pModel;
    for (uVar2 = 0; uVar2 != local_40; uVar2 = uVar2 + 1) {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::find(&local_48->_M_t,
                     (pModel->m_MaterialLib).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar2);
      if (local_50 != cVar4._M_node) {
        pOVar5 = (ObjFileImporter *)operator_new(0x10);
        aiMaterial::aiMaterial((aiMaterial *)pOVar5);
        paVar9 = *(aiString **)(cVar4._M_node + 2);
        aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9,"?mat.name",0,0);
        iVar1 = *(int *)(paVar9[0x10].data + 0x44);
        if (iVar1 == 0) {
          local_74 = 9;
        }
        else if (iVar1 == 1) {
          local_74 = 2;
        }
        else if (iVar1 == 2) {
          local_74 = 3;
        }
        else {
          local_74 = 2;
          pLVar6 = DefaultLogger::get();
          Logger::error(pLVar6,"OBJ: unexpected illumination model (0-2 recognized)");
        }
        aiMaterial::AddProperty<int>((aiMaterial *)pOVar5,&local_74,1,"$mat.shadingm",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(aiColor3D *)(paVar9[0x10].data + 0xc),1,"$clr.ambient",0,0)
        ;
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(aiColor3D *)(paVar9[0x10].data + 0x18),1,"$clr.diffuse",0,0
                  );
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(aiColor3D *)(paVar9[0x10].data + 0x24),1,"$clr.specular",0,
                   0);
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(aiColor3D *)(paVar9[0x10].data + 0x30),1,"$clr.emissive",0,
                   0);
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(float *)(paVar9[0x10].data + 0x40),1,"$mat.shininess",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(float *)(paVar9[0x10].data + 0x3c),1,"$mat.opacity",0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(aiColor3D *)(paVar9[0x10].data + 0x4c),1,"$clr.transparent"
                   ,0,0);
        aiMaterial::AddProperty
                  ((aiMaterial *)pOVar5,(float *)(paVar9[0x10].data + 0x48),1,"$mat.refracti",0,0);
        uvwIndex = 0;
        if (paVar9[1].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9 + 1,"$tex.file",1,0);
          pOVar8 = pOVar5;
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",1,0);
          if ((char)paVar9[0x10].length == '\x01') {
            addTextureMappingModeProperty(pOVar8,(aiMaterial *)pOVar5,aiTextureType_DIFFUSE,1,0);
          }
        }
        if (paVar9[3].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9 + 3,"$tex.file",3,0);
          pOVar8 = pOVar5;
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",3,0);
          if (*(char *)((long)&paVar9[0x10].length + 2) == '\x01') {
            addTextureMappingModeProperty(pOVar8,(aiMaterial *)pOVar5,aiTextureType_AMBIENT,1,0);
          }
        }
        if (paVar9[4].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9 + 4,"$tex.file",4,0);
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",4,0);
        }
        if (paVar9[2].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9 + 2,"$tex.file",2,0);
          pOVar8 = pOVar5;
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",2,0);
          if (*(char *)((long)&paVar9[0x10].length + 1) == '\x01') {
            addTextureMappingModeProperty(pOVar8,(aiMaterial *)pOVar5,aiTextureType_SPECULAR,1,0);
          }
        }
        local_38 = uVar2;
        if (paVar9[5].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9 + 5,"$tex.file",5,0);
          pOVar8 = pOVar5;
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",5,0);
          if (paVar9[0x10].data[0] == '\x01') {
            addTextureMappingModeProperty(pOVar8,(aiMaterial *)pOVar5,aiTextureType_HEIGHT,1,0);
          }
        }
        if (paVar9[6].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)pOVar5,paVar9 + 6,"$tex.file",6,0);
          pOVar8 = pOVar5;
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",6,0);
          if (paVar9[0x10].data[1] == '\x01') {
            addTextureMappingModeProperty(pOVar8,(aiMaterial *)pOVar5,aiTextureType_NORMALS,1,0);
          }
        }
        local_80 = pOVar5;
        local_70 = paVar9;
        if (paVar9[7].length != 0) {
          pInput = paVar9 + 7;
          bVar11 = paVar9[8].length == 0;
          for (lVar10 = 0; pOVar5 = local_80, (ulong)!bVar11 * 5 + 1 != lVar10; lVar10 = lVar10 + 1)
          {
            index = (uint)lVar10;
            aiMaterial::AddProperty((aiMaterial *)local_80,pInput,"$tex.file",0xb,index);
            aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",0xb,index);
            if (local_70[0x10].data[((ulong)bVar11 ^ 7) - 4] == '\x01') {
              addTextureMappingModeProperty
                        (pOVar5,(aiMaterial *)local_80,aiTextureType_REFLECTION,1,index);
            }
            pInput = pInput + 1;
          }
        }
        paVar9 = local_70;
        pOVar5 = local_80;
        if (local_70[0xf].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)local_80,local_70 + 0xf,"$tex.file",9,0);
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",9,0);
          if (paVar9[0x10].data[0xb] == '\x01') {
            addTextureMappingModeProperty
                      (pOVar5,(aiMaterial *)local_80,aiTextureType_DISPLACEMENT,1,0);
          }
        }
        uVar2 = local_38;
        pModel = local_58;
        pOVar5 = local_80;
        if (paVar9[0xe].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)local_80,paVar9 + 0xe,"$tex.file",8,0);
          paVar9 = local_70;
          aiMaterial::AddProperty((aiMaterial *)pOVar5,&uvwIndex,1,"$tex.uvwsrc",8,0);
          if (paVar9[0x10].data[10] == '\x01') {
            addTextureMappingModeProperty(pOVar5,(aiMaterial *)local_80,aiTextureType_OPACITY,1,0);
          }
        }
        pOVar5 = local_80;
        if (paVar9[0xd].length != 0) {
          aiMaterial::AddProperty((aiMaterial *)local_80,paVar9 + 0xd,"$tex.file",7,0);
          pOVar8 = local_80;
          aiMaterial::AddProperty((aiMaterial *)local_80,&uvwIndex,1,"$tex.uvwsrc",7,0);
          pOVar5 = local_80;
          if (paVar9[0x10].data[9] == '\x01') {
            addTextureMappingModeProperty(pOVar8,(aiMaterial *)local_80,aiTextureType_SHININESS,1,0)
            ;
          }
        }
        local_68->mMaterials[local_68->mNumMaterials] = (aiMaterial *)pOVar5;
        local_68->mNumMaterials = local_68->mNumMaterials + 1;
      }
    }
    if (local_68->mNumMaterials != (uint)local_60) {
      __assert_fail("pScene->mNumMaterials == numMaterials",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0x2f9,
                    "void Assimp::ObjFileImporter::createMaterials(const ObjFile::Model *, aiScene *)"
                   );
    }
  }
  return;
}

Assistant:

void ObjFileImporter::createMaterials(const ObjFile::Model* pModel, aiScene* pScene ) {
    if ( NULL == pScene ) {
        return;
    }

    const unsigned int numMaterials = (unsigned int) pModel->m_MaterialLib.size();
    pScene->mNumMaterials = 0;
    if ( pModel->m_MaterialLib.empty() ) {
        ASSIMP_LOG_DEBUG("OBJ: no materials specified");
        return;
    }

    pScene->mMaterials = new aiMaterial*[ numMaterials ];
    for ( unsigned int matIndex = 0; matIndex < numMaterials; matIndex++ )
    {
        // Store material name
        std::map<std::string, ObjFile::Material*>::const_iterator it;
        it = pModel->m_MaterialMap.find( pModel->m_MaterialLib[ matIndex ] );

        // No material found, use the default material
        if ( pModel->m_MaterialMap.end() == it )
            continue;

        aiMaterial* mat = new aiMaterial;
        ObjFile::Material *pCurrentMaterial = (*it).second;
        mat->AddProperty( &pCurrentMaterial->MaterialName, AI_MATKEY_NAME );

        // convert illumination model
        int sm = 0;
        switch (pCurrentMaterial->illumination_model)
        {
        case 0:
            sm = aiShadingMode_NoShading;
            break;
        case 1:
            sm = aiShadingMode_Gouraud;
            break;
        case 2:
            sm = aiShadingMode_Phong;
            break;
        default:
            sm = aiShadingMode_Gouraud;
            ASSIMP_LOG_ERROR("OBJ: unexpected illumination model (0-2 recognized)");
        }

        mat->AddProperty<int>( &sm, 1, AI_MATKEY_SHADING_MODEL);

        // Adding material colors
        mat->AddProperty( &pCurrentMaterial->ambient, 1, AI_MATKEY_COLOR_AMBIENT );
        mat->AddProperty( &pCurrentMaterial->diffuse, 1, AI_MATKEY_COLOR_DIFFUSE );
        mat->AddProperty( &pCurrentMaterial->specular, 1, AI_MATKEY_COLOR_SPECULAR );
        mat->AddProperty( &pCurrentMaterial->emissive, 1, AI_MATKEY_COLOR_EMISSIVE );
        mat->AddProperty( &pCurrentMaterial->shineness, 1, AI_MATKEY_SHININESS );
        mat->AddProperty( &pCurrentMaterial->alpha, 1, AI_MATKEY_OPACITY );
        mat->AddProperty( &pCurrentMaterial->transparent,1,AI_MATKEY_COLOR_TRANSPARENT);

        // Adding refraction index
        mat->AddProperty( &pCurrentMaterial->ior, 1, AI_MATKEY_REFRACTI );

        // Adding textures
        const int uvwIndex = 0;

        if ( 0 != pCurrentMaterial->texture.length )
        {
            mat->AddProperty( &pCurrentMaterial->texture, AI_MATKEY_TEXTURE_DIFFUSE(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_DIFFUSE(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureDiffuseType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_DIFFUSE);
            }
        }

        if ( 0 != pCurrentMaterial->textureAmbient.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureAmbient, AI_MATKEY_TEXTURE_AMBIENT(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_AMBIENT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureAmbientType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_AMBIENT);
            }
        }

        if ( 0 != pCurrentMaterial->textureEmissive.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureEmissive, AI_MATKEY_TEXTURE_EMISSIVE(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_EMISSIVE(0) );
        }

        if ( 0 != pCurrentMaterial->textureSpecular.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureSpecular, AI_MATKEY_TEXTURE_SPECULAR(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_SPECULAR(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureSpecularType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_SPECULAR);
            }
        }

        if ( 0 != pCurrentMaterial->textureBump.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureBump, AI_MATKEY_TEXTURE_HEIGHT(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_HEIGHT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureBumpType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_HEIGHT);
            }
        }

        if ( 0 != pCurrentMaterial->textureNormal.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureNormal, AI_MATKEY_TEXTURE_NORMALS(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_NORMALS(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureNormalType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_NORMALS);
            }
        }

        if( 0 != pCurrentMaterial->textureReflection[0].length )
        {
            ObjFile::Material::TextureType type = 0 != pCurrentMaterial->textureReflection[1].length ?
                ObjFile::Material::TextureReflectionCubeTopType :
                ObjFile::Material::TextureReflectionSphereType;

            unsigned count = type == ObjFile::Material::TextureReflectionSphereType ? 1 : 6;
            for( unsigned i = 0; i < count; i++ )
            {
                mat->AddProperty(&pCurrentMaterial->textureReflection[i], AI_MATKEY_TEXTURE_REFLECTION(i));
                mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_REFLECTION(i) );

                if(pCurrentMaterial->clamp[type])
                    addTextureMappingModeProperty(mat, aiTextureType_REFLECTION, 1, i);
            }
        }

        if ( 0 != pCurrentMaterial->textureDisp.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureDisp, AI_MATKEY_TEXTURE_DISPLACEMENT(0) );
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_DISPLACEMENT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureDispType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_DISPLACEMENT);
            }
        }

        if ( 0 != pCurrentMaterial->textureOpacity.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureOpacity, AI_MATKEY_TEXTURE_OPACITY(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_OPACITY(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureOpacityType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_OPACITY);
            }
        }

        if ( 0 != pCurrentMaterial->textureSpecularity.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureSpecularity, AI_MATKEY_TEXTURE_SHININESS(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_SHININESS(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureSpecularityType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_SHININESS);
            }
        }

        // Store material property info in material array in scene
        pScene->mMaterials[ pScene->mNumMaterials ] = mat;
        pScene->mNumMaterials++;
    }

    // Test number of created materials.
    ai_assert( pScene->mNumMaterials == numMaterials );
}